

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall VmaAllocator_T::CalculateStatistics(VmaAllocator_T *this,VmaTotalStatistics *pStats)

{
  VmaDetailedStatistics *inoutStats;
  undefined8 *puVar1;
  bool bVar2;
  uint uVar3;
  VmaBlockVector *blockVector;
  ulong uVar4;
  ItemType *this_00;
  VmaTotalStatistics *pVVar5;
  long lVar6;
  VmaDetailedStatistics *src;
  VmaDedicatedAllocationList *this_01;
  ulong uVar7;
  
  inoutStats = &pStats->total;
  *(undefined8 *)((long)&(pStats->total).statistics.blockBytes + 4) = 0;
  *(undefined8 *)((long)&(pStats->total).statistics.allocationBytes + 4) = 0;
  (pStats->total).statistics.blockCount = 0;
  (pStats->total).statistics.allocationCount = 0;
  (pStats->total).statistics.blockBytes = 0;
  (pStats->total).allocationSizeMin = 0xffffffffffffffff;
  (pStats->total).allocationSizeMax = 0;
  (pStats->total).unusedRangeSizeMin = 0xffffffffffffffff;
  (pStats->total).unusedRangeSizeMax = 0;
  lVar6 = 0;
  do {
    puVar1 = (undefined8 *)((long)&pStats->memoryType[0].statistics.blockBytes + lVar6 + 4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&pStats->memoryType[0].statistics.blockCount + lVar6);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)&pStats->memoryType[0].allocationSizeMin + lVar6) = 0xffffffffffffffff;
    *(undefined8 *)((long)&pStats->memoryType[0].allocationSizeMax + lVar6) = 0;
    *(undefined8 *)((long)&pStats->memoryType[0].unusedRangeSizeMin + lVar6) = 0xffffffffffffffff;
    *(undefined8 *)((long)&pStats->memoryType[0].unusedRangeSizeMax + lVar6) = 0;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x800);
  src = pStats->memoryHeap;
  lVar6 = 0;
  do {
    puVar1 = (undefined8 *)((long)&pStats->memoryHeap[0].statistics.blockBytes + lVar6 + 4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&pStats->memoryHeap[0].statistics.blockCount + lVar6);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)&pStats->memoryHeap[0].allocationSizeMin + lVar6) = 0xffffffffffffffff;
    *(undefined8 *)((long)&pStats->memoryHeap[0].allocationSizeMax + lVar6) = 0;
    *(undefined8 *)((long)&pStats->memoryHeap[0].unusedRangeSizeMin + lVar6) = 0xffffffffffffffff;
    *(undefined8 *)((long)&pStats->memoryHeap[0].unusedRangeSizeMax + lVar6) = 0;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x400);
  uVar3 = (this->m_MemProps).memoryTypeCount;
  uVar7 = (ulong)uVar3;
  if (uVar3 != 0) {
    uVar4 = 0;
    pVVar5 = pStats;
    do {
      if (this->m_pBlockVectors[uVar4] != (VmaBlockVector *)0x0) {
        VmaBlockVector::AddDetailedStatistics(this->m_pBlockVectors[uVar4],pVVar5->memoryType);
        uVar7 = (ulong)(this->m_MemProps).memoryTypeCount;
      }
      uVar4 = uVar4 + 1;
      pVVar5 = (VmaTotalStatistics *)(pVVar5->memoryType + 1);
    } while (uVar4 < uVar7);
  }
  bVar2 = this->m_UseMutex;
  if (bVar2 == true) {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&this->m_PoolsMutex);
  }
  for (this_00 = (this->m_Pools).m_Front; this_00 != (ItemType *)0x0; this_00 = this_00->m_NextPool)
  {
    uVar3 = (this_00->m_BlockVector).m_MemoryTypeIndex;
    VmaBlockVector::AddDetailedStatistics(&this_00->m_BlockVector,pStats->memoryType + uVar3);
    VmaDedicatedAllocationList::AddDetailedStatistics
              (&this_00->m_DedicatedAllocations,pStats->memoryType + uVar3);
  }
  if (bVar2 != false) {
    pthread_rwlock_unlock((pthread_rwlock_t *)&this->m_PoolsMutex);
  }
  if ((this->m_MemProps).memoryTypeCount != 0) {
    this_01 = this->m_DedicatedAllocations;
    uVar7 = 0;
    pVVar5 = pStats;
    do {
      VmaDedicatedAllocationList::AddDetailedStatistics(this_01,pVVar5->memoryType);
      uVar7 = uVar7 + 1;
      uVar3 = (this->m_MemProps).memoryTypeCount;
      this_01 = this_01 + 1;
      pVVar5 = (VmaTotalStatistics *)(pVVar5->memoryType + 1);
    } while (uVar7 < uVar3);
    if (uVar3 != 0) {
      uVar7 = 0;
      do {
        VmaAddDetailedStatistics
                  (src + (this->m_MemProps).memoryTypes[uVar7].heapIndex,pStats->memoryType);
        uVar7 = uVar7 + 1;
        pStats = (VmaTotalStatistics *)(pStats->memoryType + 1);
      } while (uVar7 < (this->m_MemProps).memoryTypeCount);
    }
  }
  if ((this->m_MemProps).memoryHeapCount != 0) {
    uVar7 = 0;
    do {
      VmaAddDetailedStatistics(inoutStats,src);
      uVar7 = uVar7 + 1;
      src = src + 1;
    } while (uVar7 < (this->m_MemProps).memoryHeapCount);
  }
  return;
}

Assistant:

void VmaAllocator_T::CalculateStatistics(VmaTotalStatistics* pStats)
{
    // Initialize.
    VmaClearDetailedStatistics(pStats->total);
    for(uint32_t i = 0; i < VK_MAX_MEMORY_TYPES; ++i)
        VmaClearDetailedStatistics(pStats->memoryType[i]);
    for(uint32_t i = 0; i < VK_MAX_MEMORY_HEAPS; ++i)
        VmaClearDetailedStatistics(pStats->memoryHeap[i]);

    // Process default pools.
    for(uint32_t memTypeIndex = 0; memTypeIndex < GetMemoryTypeCount(); ++memTypeIndex)
    {
        VmaBlockVector* const pBlockVector = m_pBlockVectors[memTypeIndex];
        if (pBlockVector != VMA_NULL)
            pBlockVector->AddDetailedStatistics(pStats->memoryType[memTypeIndex]);
    }

    // Process custom pools.
    {
        VmaMutexLockRead lock(m_PoolsMutex, m_UseMutex);
        for(VmaPool pool = m_Pools.Front(); pool != VMA_NULL; pool = m_Pools.GetNext(pool))
        {
            VmaBlockVector& blockVector = pool->m_BlockVector;
            const uint32_t memTypeIndex = blockVector.GetMemoryTypeIndex();
            blockVector.AddDetailedStatistics(pStats->memoryType[memTypeIndex]);
            pool->m_DedicatedAllocations.AddDetailedStatistics(pStats->memoryType[memTypeIndex]);
        }
    }

    // Process dedicated allocations.
    for(uint32_t memTypeIndex = 0; memTypeIndex < GetMemoryTypeCount(); ++memTypeIndex)
    {
        m_DedicatedAllocations[memTypeIndex].AddDetailedStatistics(pStats->memoryType[memTypeIndex]);
    }

    // Sum from memory types to memory heaps.
    for(uint32_t memTypeIndex = 0; memTypeIndex < GetMemoryTypeCount(); ++memTypeIndex)
    {
        const uint32_t memHeapIndex = m_MemProps.memoryTypes[memTypeIndex].heapIndex;
        VmaAddDetailedStatistics(pStats->memoryHeap[memHeapIndex], pStats->memoryType[memTypeIndex]);
    }

    // Sum from memory heaps to total.
    for(uint32_t memHeapIndex = 0; memHeapIndex < GetMemoryHeapCount(); ++memHeapIndex)
        VmaAddDetailedStatistics(pStats->total, pStats->memoryHeap[memHeapIndex]);

    VMA_ASSERT(pStats->total.statistics.allocationCount == 0 ||
        pStats->total.allocationSizeMax >= pStats->total.allocationSizeMin);
    VMA_ASSERT(pStats->total.unusedRangeCount == 0 ||
        pStats->total.unusedRangeSizeMax >= pStats->total.unusedRangeSizeMin);
}